

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

int __thiscall ONX_Model::AddDefaultLayer(ONX_Model *this,wchar_t *layer_name,ON_Color layer_color)

{
  ON_3dmSettings *this_00;
  bool bVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ON_Layer *pOVar7;
  wchar_t *component_name;
  ON_UUID *pOVar8;
  ON_ModelComponentReference *this_01;
  ON_UUID layer_model_id;
  ON_ModelComponentReference mcr;
  ON_ModelComponentReference mr;
  ON_UUID default_layer_id;
  ON_Layer default_layer;
  uint in_stack_fffffffffffffe8c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_164;
  ON_3dmSettings *local_160;
  int local_154;
  undefined1 local_150 [24];
  undefined1 local_138 [16];
  ON_UUID local_128;
  
  this_00 = &this->m_settings;
  local_164 = layer_color.field_0;
  local_128 = ON_3dmSettings::CurrentLayerId(this_00);
  local_160 = this_00;
  local_154 = ON_3dmSettings::CurrentLayerIndex(this_00);
  local_150._16_8_ = &this->m_manifest;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    if (bVar1) {
      bVar2 = ::operator==(&ON_nil_uuid,&local_128);
      if (!bVar2) {
        layer_model_id.Data4 = (uchar  [8])local_128._0_8_;
        layer_model_id._0_8_ = this;
        LayerFromId((ONX_Model *)local_150,layer_model_id);
        goto LAB_00461773;
      }
    }
    else {
      if (local_154 == -0x7fffffff) break;
      LayerFromIndex((ONX_Model *)local_150,(int)this);
LAB_00461773:
      pOVar7 = ON_Layer::FromModelComponentRef
                         ((ON_ModelComponentReference *)local_150,(ON_Layer *)0x0);
      if (pOVar7 != (ON_Layer *)0x0) {
        bVar2 = ON_ModelComponent::IsSystemComponent(&pOVar7->super_ON_ModelComponent);
        if ((((bVar2) ||
             (iVar4 = ON_ModelComponent::Index(&pOVar7->super_ON_ModelComponent), iVar4 < 0)) ||
            (bVar2 = ON_ModelComponent::ParentIdIsNil(&pOVar7->super_ON_ModelComponent), !bVar2)) ||
           ((bVar2 = ON_Layer::IsVisible(pOVar7), !bVar2 ||
            (bVar2 = ON_ModelComponent::IsLocked(&pOVar7->super_ON_ModelComponent), bVar2)))) {
          ON_Layer::ON_Layer((ON_Layer *)&stack0xfffffffffffffee8,pOVar7);
          ON_ModelComponent::ClearId((ON_ModelComponent *)&stack0xfffffffffffffee8);
          ON_ModelComponent::ClearIndex((ON_ModelComponent *)&stack0xfffffffffffffee8);
          ON_ModelComponent::ClearParentId((ON_ModelComponent *)&stack0xfffffffffffffee8);
          ON_Layer::SetVisible((ON_Layer *)&stack0xfffffffffffffee8,true);
          ON_Layer::SetLocked((ON_Layer *)&stack0xfffffffffffffee8,false);
          if ((layer_name == (wchar_t *)0x0) || (*layer_name == L'\0')) {
            layer_name = ON_ModelComponent::NameAsPointer(&pOVar7->super_ON_ModelComponent);
          }
          TVar3 = ON_ModelComponent::ComponentType((ON_ModelComponent *)&stack0xfffffffffffffee8);
          ON_ComponentManifest::UnusedName
                    ((ON_ComponentManifest *)local_138,(Type)local_150._16_8_,
                     (ON_UUID)ZEXT116(TVar3),(wchar_t *)(uchar  [8])0x0,layer_name,(wchar_t *)0x0,0,
                     (uint *)((ulong)in_stack_fffffffffffffe8c << 0x20));
          component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_138);
          ON_ModelComponent::SetName((ON_ModelComponent *)&stack0xfffffffffffffee8,component_name);
          ON_wString::~ON_wString((ON_wString *)local_138);
          uVar5 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
          uVar6 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_164);
          if (uVar5 != uVar6) {
            ON_Layer::SetColor((ON_Layer *)&stack0xfffffffffffffee8,(ON_Color)local_164);
          }
          AddModelComponent((ONX_Model *)local_138,(ON_ModelComponent *)this,
                            SUB81((ON_Layer *)&stack0xfffffffffffffee8,0));
          pOVar7 = ON_Layer::FromModelComponentRef
                             ((ON_ModelComponentReference *)local_138,(ON_Layer *)0x0);
          if (((pOVar7 == (ON_Layer *)0x0) ||
              (iVar4 = ON_ModelComponent::Index(&pOVar7->super_ON_ModelComponent), iVar4 < 0)) ||
             (bVar2 = ON_ModelComponent::IsSystemComponent(&pOVar7->super_ON_ModelComponent), bVar2)
             ) {
            ON_ModelComponentReference::~ON_ModelComponentReference
                      ((ON_ModelComponentReference *)local_138);
            ON_Layer::~ON_Layer((ON_Layer *)&stack0xfffffffffffffee8);
            goto LAB_004618ee;
          }
          pOVar8 = ON_ModelComponent::Id(&pOVar7->super_ON_ModelComponent);
          ON_3dmSettings::SetCurrentLayerId(local_160,*pOVar8);
          iVar4 = ON_ModelComponent::Index(&pOVar7->super_ON_ModelComponent);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_138);
          ON_Layer::~ON_Layer((ON_Layer *)&stack0xfffffffffffffee8);
        }
        else {
          pOVar8 = ON_ModelComponent::Id(&pOVar7->super_ON_ModelComponent);
          ON_3dmSettings::SetCurrentLayerId(local_160,*pOVar8);
          iVar4 = ON_ModelComponent::Index(&pOVar7->super_ON_ModelComponent);
        }
        this_01 = (ON_ModelComponentReference *)local_150;
        goto LAB_004619f3;
      }
LAB_004618ee:
      ON_ModelComponentReference::~ON_ModelComponentReference
                ((ON_ModelComponentReference *)local_150);
    }
    bVar2 = false;
  } while (bVar1);
  iVar4 = AddLayer(this,layer_name,(ON_Color)local_164);
  if (-1 < iVar4) {
    LayerFromIndex((ONX_Model *)&stack0xfffffffffffffee8,(int)this);
    pOVar7 = ON_Layer::FromModelComponentRef
                       ((ON_ModelComponentReference *)&stack0xfffffffffffffee8,(ON_Layer *)0x0);
    if (((pOVar7 != (ON_Layer *)0x0) &&
        (iVar4 = ON_ModelComponent::Index(&pOVar7->super_ON_ModelComponent), -1 < iVar4)) &&
       (bVar2 = ON_ModelComponent::IsSystemComponent(&pOVar7->super_ON_ModelComponent), !bVar2)) {
      pOVar8 = ON_ModelComponent::Id(&pOVar7->super_ON_ModelComponent);
      ON_3dmSettings::SetCurrentLayerId(local_160,*pOVar8);
      iVar4 = ON_ModelComponent::Index(&pOVar7->super_ON_ModelComponent);
      this_01 = (ON_ModelComponentReference *)&stack0xfffffffffffffee8;
LAB_004619f3:
      ON_ModelComponentReference::~ON_ModelComponentReference(this_01);
      return iVar4;
    }
    ON_ModelComponentReference::~ON_ModelComponentReference
              ((ON_ModelComponentReference *)&stack0xfffffffffffffee8);
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,0x4f2,"","Failed to add default layer.");
  return -0x7fffffff;
}

Assistant:

int ONX_Model::AddDefaultLayer(
  const wchar_t* layer_name,
  ON_Color layer_color
)
{
  ON_UUID default_layer_id = m_settings.CurrentLayerId();
  int default_layer_index = m_settings.CurrentLayerIndex();
  for ( int pass = 0; pass < 2; pass++ )
  {
    if (0 == pass)
    {
      if (ON_nil_uuid == default_layer_id)
        continue;
    }
    else 
    {
      if (ON_UNSET_INT_INDEX == default_layer_index)
        continue;
    }
    ON_ModelComponentReference mcr
      = (0 == pass)
      ? LayerFromId(default_layer_id)
      : LayerFromIndex(default_layer_index);

    const ON_Layer* layer = ON_Layer::FromModelComponentRef(mcr, nullptr);
    if (nullptr == layer)
      continue;
    if (false == layer->IsSystemComponent() && layer->Index() >= 0 && layer->ParentIdIsNil() && layer->IsVisible() && false == layer->IsLocked() )
    {
      m_settings.SetCurrentLayerId(layer->Id());
      return layer->Index();
    }
    ON_Layer default_layer(*layer);
    default_layer.ClearId();
    default_layer.ClearIndex();
    default_layer.ClearParentId();
    default_layer.SetVisible(true);
    default_layer.SetLocked(false);

    if (nullptr == layer_name || 0 == layer_name[0])
      layer_name = layer->NameAsPointer();
    default_layer.SetName(m_manifest.UnusedName(default_layer.ComponentType(), ON_nil_uuid, layer_name, nullptr, nullptr, 0, nullptr) );

    if (ON_Color::UnsetColor != layer_color)
      default_layer.SetColor(layer_color);

    const ON_ModelComponentReference mr = AddModelComponent(default_layer, true);
    const ON_Layer* managed_layer = ON_Layer::FromModelComponentRef(mr, nullptr);
    if (nullptr != managed_layer && managed_layer->Index() >= 0 && false == managed_layer->IsSystemComponent())
    {
      m_settings.SetCurrentLayerId(managed_layer->Id());
      return managed_layer->Index();
    }
  }

  int layer_index = AddLayer(layer_name, layer_color);
  if (layer_index >= 0)
  {
    const ON_ModelComponentReference mr = LayerFromIndex(layer_index);
    const ON_Layer* managed_layer = ON_Layer::FromModelComponentRef(mr, nullptr);
    if (nullptr != managed_layer && managed_layer->Index() >= 0 && false == managed_layer->IsSystemComponent())
    {
      m_settings.SetCurrentLayerId(managed_layer->Id());
      return managed_layer->Index();
    }
  }

  ON_ERROR("Failed to add default layer.");
  return ON_UNSET_INT_INDEX;  
}